

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O0

void ws_handler(nng_http *conn,void *arg,nng_aio *aio)

{
  long lVar1;
  long lVar2;
  _Bool _Var3;
  int iVar4;
  nng_err nVar5;
  nng_http_status nVar6;
  char *pcVar7;
  void *local_70;
  ws_header *hdr;
  char key [29];
  ushort local_42;
  int rv;
  uint16_t status;
  char *proto;
  char *ptr;
  nni_ws *ws;
  nni_ws_listener *l;
  nng_aio *aio_local;
  void *arg_local;
  nng_http *conn_local;
  
  ws = (nni_ws *)arg;
  l = (nni_ws_listener *)aio;
  aio_local = (nng_aio *)arg;
  arg_local = conn;
  nni_mtx_lock((nni_mtx *)((long)arg + 0x60));
  if (((ws->txaio).a_sleep & 1U) == 0) {
    pcVar7 = nng_http_get_version((nng_http *)arg_local);
    iVar4 = strcmp(pcVar7,"HTTP/1.1");
    if (iVar4 == 0) {
      pcVar7 = nng_http_get_method((nng_http *)arg_local);
      iVar4 = strcmp(pcVar7,"GET");
      if (iVar4 == 0) {
        pcVar7 = nng_http_get_header((nng_http *)arg_local,"Content-Length");
        if (((pcVar7 == (char *)0x0) || (iVar4 = atoi(pcVar7), iVar4 < 1)) &&
           ((pcVar7 = nng_http_get_header((nng_http *)arg_local,"Transfer-Encoding"),
            pcVar7 == (char *)0x0 ||
            (pcVar7 = nni_strcasestr(pcVar7,"chunked"), pcVar7 == (char *)0x0)))) {
          pcVar7 = nng_http_get_header((nng_http *)arg_local,"Upgrade");
          if (((((pcVar7 == (char *)0x0) || (_Var3 = ws_contains_word(pcVar7,"websocket"), !_Var3))
               || (pcVar7 = nng_http_get_header((nng_http *)arg_local,"Connection"),
                  pcVar7 == (char *)0x0)) ||
              ((_Var3 = ws_contains_word(pcVar7,"upgrade"), !_Var3 ||
               (pcVar7 = nng_http_get_header((nng_http *)arg_local,"Sec-WebSocket-Version"),
               pcVar7 == (char *)0x0)))) || (iVar4 = strcmp(pcVar7,"13"), iVar4 != 0)) {
            local_42 = 400;
          }
          else {
            pcVar7 = nng_http_get_header((nng_http *)arg_local,"Sec-WebSocket-Key");
            if ((pcVar7 == (char *)0x0) || (iVar4 = ws_make_accept(pcVar7,(char *)&hdr), iVar4 != 0)
               ) {
              local_42 = 400;
            }
            else {
              pcVar7 = nng_http_get_header((nng_http *)arg_local,"Sec-WebSocket-Protocol");
              if (pcVar7 == (char *)0x0) {
                lVar1._0_1_ = ws->recv_text;
                lVar1._1_1_ = ws->recv_res;
                lVar1._2_6_ = *(undefined6 *)&ws->field_0x5a;
                if (lVar1 != 0) {
                  local_42 = 400;
                  goto LAB_0013ab5d;
                }
              }
              else {
                lVar2._0_1_ = ws->recv_text;
                lVar2._1_1_ = ws->recv_res;
                lVar2._2_6_ = *(undefined6 *)&ws->field_0x5a;
                if ((lVar2 == 0) ||
                   (_Var3 = ws_contains_word(*(char **)&ws->recv_text,pcVar7), !_Var3)) {
                  local_42 = 400;
                  goto LAB_0013ab5d;
                }
              }
              nng_http_set_status((nng_http *)arg_local,NNG_HTTP_STATUS_SWITCHING,(char *)0x0);
              for (local_70 = nni_list_first((nni_list *)&(ws->txaio).a_task.task_cb);
                  local_70 != (void *)0x0;
                  local_70 = nni_list_next((nni_list *)&(ws->txaio).a_task.task_cb,local_70)) {
                nVar5 = nng_http_set_header((nng_http *)arg_local,*(char **)((long)local_70 + 0x10),
                                            *(char **)((long)local_70 + 0x18));
                if (nVar5 != NNG_OK) {
                  local_42 = 500;
                  goto LAB_0013ab5d;
                }
              }
              if ((ws->txaio).a_task.task_node.ln_prev != (nni_list_node *)0x0) {
                key._24_4_ = (*(code *)(ws->txaio).a_task.task_node.ln_prev)
                                       ((ws->txaio).a_task.task_arg);
                if (key._24_4_ != NNG_OK) {
                  nni_aio_finish_error((nni_aio *)l,key._24_4_);
                  nni_mtx_unlock(&ws->mtx);
                  return;
                }
                nVar6 = nng_http_get_status((nng_http *)arg_local);
                if (nVar6 != NNG_HTTP_STATUS_SWITCHING) {
                  nni_aio_finish((nni_aio *)l,NNG_OK,0);
                  nni_mtx_unlock(&ws->mtx);
                  return;
                }
              }
              key._24_4_ = ws_init((nni_ws **)&ptr);
              if (key._24_4_ == 0) {
                *(void **)(ptr + 0x9e8) = arg_local;
                ptr[0x50] = '\x01';
                *(long *)(ptr + 0x9f0) = (ws->txaio).a_task.task_mtx.mtx.__align;
                *(undefined8 *)(ptr + 0x9f8) =
                     *(undefined8 *)((long)&(ws->txaio).a_task.task_mtx.mtx + 8);
                *(undefined8 *)(ptr + 0xa00) =
                     *(undefined8 *)((long)&(ws->txaio).a_task.task_mtx.mtx + 0x10);
                ptr[0x55] = (ws->txaio).a_expire_ok & 1;
                ptr[0x58] = (ws->txaio).a_use_expire & 1;
                ptr[0x57] = (ws->txaio).a_expiring & 1;
                *(nni_ws **)(ptr + 0xa08) = ws;
                *(ws_header **)(ptr + 0xa18) = hdr;
                *(undefined8 *)(ptr + 0xa20) = key._0_8_;
                *(undefined8 *)(ptr + 0xa28) = key._8_8_;
                *(undefined4 *)(ptr + 0xa30) = key._16_4_;
                ptr[0xa34] = key[0x14];
                nni_http_set_static_header
                          ((nng_http *)arg_local,(nni_http_header *)(ptr + 0xa38),"Connection",
                           "Upgrade");
                nni_http_set_static_header
                          ((nng_http *)arg_local,(nni_http_header *)(ptr + 0xa60),"Upgrade",
                           "websocket");
                nni_http_set_static_header
                          ((nng_http *)arg_local,(nni_http_header *)(ptr + 0xa88),
                           "Sec-WebSocket-Accept",ptr + 0xa18);
                if (pcVar7 != (char *)0x0) {
                  nni_http_set_static_header
                            ((nng_http *)arg_local,(nni_http_header *)(ptr + 0xad8),
                             "Sec-WebSocket-Protocol",pcVar7);
                }
                nni_list_append((nni_list *)&(ws->rxq).ll_head.ln_prev,ptr);
                nng_http_write_response((nng_http *)arg_local,(nng_aio *)(ptr + 0x650));
                nni_http_hijack((nni_http_conn *)arg_local);
                nni_aio_set_output((nni_aio *)l,0,(void *)0x0);
                nni_aio_finish((nni_aio *)l,NNG_OK,0);
                nni_mtx_unlock(&ws->mtx);
                return;
              }
              local_42 = 500;
            }
          }
        }
        else {
          local_42 = 0x19d;
        }
      }
      else {
        local_42 = 400;
      }
    }
    else {
      local_42 = 0x1f9;
    }
  }
  else {
    local_42 = 0x1f7;
  }
LAB_0013ab5d:
  key._24_4_ = nni_http_set_error((nng_http *)arg_local,(uint)local_42,(char *)0x0,(char *)0x0);
  if (key._24_4_ == NNG_OK) {
    nni_aio_finish((nni_aio *)l,NNG_OK,0);
  }
  else {
    nni_aio_finish_error((nni_aio *)l,key._24_4_);
  }
  nni_mtx_unlock(&ws->mtx);
  return;
}

Assistant:

static void
ws_handler(nng_http *conn, void *arg, nng_aio *aio)
{
	nni_ws_listener *l = arg;
	nni_ws          *ws;
	const char      *ptr;
	const char      *proto;
	uint16_t         status;
	int              rv;
	char             key[29];
	ws_header       *hdr;

	nni_mtx_lock(&l->mtx);
	if (l->closed) {
		status = NNG_HTTP_STATUS_SERVICE_UNAVAILABLE;
		goto err;
	}

	// Now check the headers, etc.
	if (strcmp(nng_http_get_version(conn), "HTTP/1.1") != 0) {
		status = NNG_HTTP_STATUS_HTTP_VERSION_NOT_SUPP;
		goto err;
	}

	if (strcmp(nng_http_get_method(conn), "GET") != 0) {
		// HEAD request.  We can't really deal with it.
		status = NNG_HTTP_STATUS_BAD_REQUEST;
		goto err;
	}

	if ((((ptr = nng_http_get_header(conn, "Content-Length")) != NULL) &&
	        (atoi(ptr) > 0)) ||
	    (((ptr = nng_http_get_header(conn, "Transfer-Encoding")) !=
	         NULL) &&
	        (nni_strcasestr(ptr, "chunked") != NULL))) {
		status = NNG_HTTP_STATUS_CONTENT_TOO_LARGE;
		goto err;
	}

	// These headers have to be present.
	if (((ptr = nng_http_get_header(conn, "Upgrade")) == NULL) ||
	    (!ws_contains_word(ptr, "websocket")) ||
	    ((ptr = nng_http_get_header(conn, "Connection")) == NULL) ||
	    (!ws_contains_word(ptr, "upgrade")) ||
	    ((ptr = nng_http_get_header(conn, "Sec-WebSocket-Version")) ==
	        NULL) ||
	    (strcmp(ptr, "13") != 0)) {
		status = NNG_HTTP_STATUS_BAD_REQUEST;
		goto err;
	}

	if (((ptr = nng_http_get_header(conn, "Sec-WebSocket-Key")) == NULL) ||
	    (ws_make_accept(ptr, key) != 0)) {
		status = NNG_HTTP_STATUS_BAD_REQUEST;
		goto err;
	}

	// If the client has requested a specific subprotocol, then
	// we need to try to match it to what the handler says we
	// support. (If no suitable option is found in the handler, we
	// fail the request.)
	proto = nng_http_get_header(conn, "Sec-WebSocket-Protocol");
	if (proto == NULL) {
		if (l->proto != NULL) {
			status = NNG_HTTP_STATUS_BAD_REQUEST;
			goto err;
		}
	} else if ((l->proto == NULL) ||
	    (!ws_contains_word(l->proto, proto))) {
		status = NNG_HTTP_STATUS_BAD_REQUEST;
		goto err;
	}

	nng_http_set_status(conn, NNG_HTTP_STATUS_SWITCHING, NULL);

	// Set any user supplied headers.  This is better than using a hook
	// for most things, because it is loads easier.  Note that websocket
	// headers we care about will be overridden below!
	NNI_LIST_FOREACH (&l->headers, hdr) {
		if (nng_http_set_header(conn, hdr->name, hdr->value) != 0) {
			status = NNG_HTTP_STATUS_INTERNAL_SERVER_ERROR;
			goto err;
		}
	}

	// The hook function gives us the ability to intercept the HTTP
	// response altogether.  Its best not to do this unless you really
	// need to, because it's much more complex.  But if you want to set
	// up an HTTP Authorization handler this might be the only choice.
	if (l->hookfn != NULL) {
		rv = l->hookfn(l->hookarg, conn);
		if (rv != 0) {
			nni_aio_finish_error(aio, rv);
			nni_mtx_unlock(&l->mtx);
			return;
		}

		if (nng_http_get_status(conn) != NNG_HTTP_STATUS_SWITCHING) {
			// The hook has decided to give back a
			// different reply and we are not upgrading
			// anymore.  For example the Origin might not
			// be permitted, or another level of
			// authentication may be required.
			nni_aio_finish(aio, 0, 0);
			nni_mtx_unlock(&l->mtx);
			return;
		}
	}

	// We are good to go, provided we can get the websocket struct,
	// and send the reply.
	if ((rv = ws_init(&ws)) != 0) {
		status = NNG_HTTP_STATUS_INTERNAL_SERVER_ERROR;
		goto err;
	}
	ws->http      = conn;
	ws->server    = true;
	ws->maxframe  = l->maxframe;
	ws->fragsize  = l->fragsize;
	ws->recvmax   = l->recvmax;
	ws->isstream  = l->isstream;
	ws->recv_text = l->recv_text;
	ws->send_text = l->send_text;
	ws->listener  = l;
	memcpy(ws->keybuf, key, sizeof(ws->keybuf));

	nni_http_set_static_header(
	    conn, &ws->hdrs.connection, "Connection", "Upgrade");
	nni_http_set_static_header(
	    conn, &ws->hdrs.upgrade, "Upgrade", "websocket");
	nni_http_set_static_header(
	    conn, &ws->hdrs.wsaccept, "Sec-WebSocket-Accept", ws->keybuf);
	if (proto != NULL) {
		// NB: we still have the request protocol in the header, so
		// that should be fine.
		nni_http_set_static_header(
		    conn, &ws->hdrs.wsproto, "Sec-WebSocket-Protocol", proto);
	}

	nni_list_append(&l->reply, ws);
	nng_http_write_response(conn, &ws->httpaio);
	(void) nni_http_hijack(conn);
	nni_aio_set_output(aio, 0, NULL);
	nni_aio_finish(aio, 0, 0);
	nni_mtx_unlock(&l->mtx);
	return;

err:
	if ((rv = nni_http_set_error(conn, status, NULL, NULL)) != 0) {
		nni_aio_finish_error(aio, rv);
	} else {
		nni_aio_finish(aio, 0, 0);
	}
	nni_mtx_unlock(&l->mtx);
}